

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O1

void __thiscall
despot::MemoryPool<despot::RockSampleState>::NewChunk(MemoryPool<despot::RockSampleState> *this)

{
  pointer *pppCVar1;
  State *this_00;
  iterator __position;
  long lVar2;
  Chunk *chunk;
  Chunk *local_40;
  State *local_38;
  
  local_40 = (Chunk *)operator_new(0x2000);
  lVar2 = 0;
  do {
    this_00 = &local_40->Objects[0].super_State + lVar2;
    despot::State::State(this_00);
    *(undefined ***)this_00 = &PTR__State_0011a3e8;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x2000);
  __position._M_current =
       (this->chunks_).
       super__Vector_base<despot::MemoryPool<despot::RockSampleState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::RockSampleState>::Chunk_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->chunks_).
      super__Vector_base<despot::MemoryPool<despot::RockSampleState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::RockSampleState>::Chunk_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<despot::MemoryPool<despot::RockSampleState>::Chunk*,std::allocator<despot::MemoryPool<despot::RockSampleState>::Chunk*>>
    ::_M_realloc_insert<despot::MemoryPool<despot::RockSampleState>::Chunk*const&>
              ((vector<despot::MemoryPool<despot::RockSampleState>::Chunk*,std::allocator<despot::MemoryPool<despot::RockSampleState>::Chunk*>>
                *)this,__position,&local_40);
  }
  else {
    *__position._M_current = local_40;
    pppCVar1 = &(this->chunks_).
                super__Vector_base<despot::MemoryPool<despot::RockSampleState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::RockSampleState>::Chunk_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  lVar2 = 0x1fe0;
  do {
    local_38 = &local_40->Objects[0].super_State + lVar2;
    std::vector<despot::RockSampleState*,std::allocator<despot::RockSampleState*>>::
    emplace_back<despot::RockSampleState*>
              ((vector<despot::RockSampleState*,std::allocator<despot::RockSampleState*>> *)
               &this->freelist_,(RockSampleState **)&local_38);
    (&local_40->Objects[0].field_0x8)[lVar2] = 0;
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  return;
}

Assistant:

void NewChunk() {
		Chunk* chunk = new Chunk;
		chunks_.push_back(chunk);
		for (int i = Chunk::Size - 1; i >= 0; --i) {
			freelist_.push_back(&chunk->Objects[i]);
			chunk->Objects[i].ClearAllocated();
		}
	}